

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O1

void __thiscall
Js::LocalsWalker::ExpandArgumentsObject
          (LocalsWalker *this,IDiagObjectModelDisplay *argumentsDisplay)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  undefined4 *puVar5;
  undefined4 extraout_var;
  uint uVar6;
  ulong uVar7;
  IDiagObjectModelWalkerBase *pIVar8;
  undefined4 local_70 [2];
  ResolvedObject tempResolvedObj;
  WeakArenaReference<Js::IDiagObjectModelWalkerBase> *obj;
  
  if (argumentsDisplay == (IDiagObjectModelDisplay *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0x635,"(argumentsDisplay != nullptr)","argumentsDisplay != nullptr"
                               );
    if (!bVar2) goto LAB_008c04b8;
    *puVar5 = 0;
  }
  iVar3 = (*argumentsDisplay->_vptr_IDiagObjectModelDisplay[7])(argumentsDisplay);
  obj = (WeakArenaReference<Js::IDiagObjectModelWalkerBase> *)CONCAT44(extraout_var,iVar3);
  if (obj == (WeakArenaReference<Js::IDiagObjectModelWalkerBase> *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0x638,"(argumentsObjectWalkerRef != nullptr)",
                                "argumentsObjectWalkerRef != nullptr");
    if (!bVar2) {
LAB_008c04b8:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  bVar2 = Memory::ReferencedArenaAdapter::AddStrongReference(obj->adapter);
  if (bVar2) {
    pIVar8 = obj->p;
  }
  else {
    pIVar8 = (IDiagObjectModelWalkerBase *)0x0;
  }
  uVar4 = (*pIVar8->_vptr_IDiagObjectModelWalkerBase[1])(pIVar8);
  local_70[0] = 0xffffffff;
  tempResolvedObj.name._4_1_ = 0;
  tempResolvedObj.propId = 0;
  tempResolvedObj._4_4_ = 0;
  tempResolvedObj.scriptContext = (ScriptContext *)0x0;
  tempResolvedObj.address = (IDiagObjectAddress *)0x0;
  tempResolvedObj.objectDisplay = (IDiagObjectModelDisplay *)0x0;
  tempResolvedObj.obj = (Var)0x0;
  tempResolvedObj.originalObj = (Var)0x0;
  if (0 < (int)uVar4) {
    uVar7 = 0;
    do {
      (**pIVar8->_vptr_IDiagObjectModelWalkerBase)(pIVar8,uVar7,local_70);
      uVar6 = (int)uVar7 + 1;
      uVar7 = (ulong)uVar6;
    } while (uVar4 != uVar6);
  }
  Memory::ReferencedArenaAdapter::ReleaseStrongReference(obj->adapter);
  Memory::
  DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,Memory::WeakArenaReference<Js::IDiagObjectModelWalkerBase>>
            (&Memory::HeapAllocator::Instance,obj);
  return;
}

Assistant:

void LocalsWalker::ExpandArgumentsObject(IDiagObjectModelDisplay * argumentsDisplay)
    {
        Assert(argumentsDisplay != nullptr);

        WeakArenaReference<Js::IDiagObjectModelWalkerBase>* argumentsObjectWalkerRef = argumentsDisplay->CreateWalker();
        Assert(argumentsObjectWalkerRef != nullptr);

        IDiagObjectModelWalkerBase * walker = argumentsObjectWalkerRef->GetStrongReference();
        int count = (int)walker->GetChildrenCount();
        Js::ResolvedObject tempResolvedObj;
        for (int i = 0; i < count; i++)
        {
            walker->Get(i, &tempResolvedObj);
        }
        argumentsObjectWalkerRef->ReleaseStrongReference();
        HeapDelete(argumentsObjectWalkerRef);
    }